

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O2

void __thiscall
TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test::TestBody
          (TwoConnections_SyncOnSecondConnectionUpdatesFooterPos_Test *this)

{
  pointer *__ptr;
  database *pdVar1;
  _func_int **pp_Var2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  typed_address<pstore::trailer> local_70;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> transaction;
  
  pdVar1 = &(this->super_TwoConnections).first;
  pstore::begin(&transaction,pdVar1);
  anon_unknown.dwarf_36f446::append_int(&transaction.super_transaction_base,(int)pdVar1);
  pstore::transaction_base::commit(&transaction.super_transaction_base);
  pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>::~transaction(&transaction);
  pdVar1 = &(this->super_TwoConnections).second;
  pstore::database::sync(pdVar1);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_TwoConnections).first.size_.footer_pos_.a_.a_;
  local_70.a_.a_ = (address)(this->super_TwoConnections).second.size_.footer_pos_.a_.a_;
  testing::internal::
  CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
            ((internal *)&transaction,"first.footer_pos ()","second.footer_pos ()",
             (typed_address<pstore::trailer> *)&local_78,&local_70);
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var2 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var2 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x5f,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  pstore::database::sync(pdVar1);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_TwoConnections).second.size_.footer_pos_.a_.a_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&transaction,"pstore::leader_size","second.footer_pos ().absolute ()",
             &pstore::leader_size,(unsigned_long *)&local_78);
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var2 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var2 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x61,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  pstore::database::sync(pdVar1);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_TwoConnections).first.size_.footer_pos_.a_.a_;
  local_70.a_.a_ = (address)(this->super_TwoConnections).second.size_.footer_pos_.a_.a_;
  testing::internal::
  CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
            ((internal *)&transaction,"first.footer_pos ()","second.footer_pos ()",
             (typed_address<pstore::trailer> *)&local_78,&local_70);
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var2 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var2 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,99,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  pstore::database::sync(pdVar1);
  local_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_TwoConnections).second.size_.footer_pos_.a_.a_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&transaction,"pstore::leader_size","second.footer_pos ().absolute ()",
             &pstore::leader_size,(unsigned_long *)&local_78);
  if ((char)transaction.super_transaction_base._vptr_transaction_base == '\0') {
    testing::Message::Message((Message *)&local_78);
    if (transaction.super_transaction_base.db_ == (database *)0x0) {
      pp_Var2 = (_func_int **)0x1ec539;
    }
    else {
      pp_Var2 = (transaction.super_transaction_base.db_)->_vptr_database;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x65,(char *)pp_Var2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&transaction.super_transaction_base.db_);
  return;
}

Assistant:

TEST_F (TwoConnections, SyncOnSecondConnectionUpdatesFooterPos) {
    {
        auto transaction = pstore::begin (first);
        append_int (transaction, 1);
        transaction.commit ();
    }
    second.sync ();
    EXPECT_EQ (first.footer_pos (), second.footer_pos ());
    second.sync (0U);
    EXPECT_EQ (pstore::leader_size, second.footer_pos ().absolute ());
    second.sync (1U);
    EXPECT_EQ (first.footer_pos (), second.footer_pos ());
    second.sync (0U);
    EXPECT_EQ (pstore::leader_size, second.footer_pos ().absolute ());
}